

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilBridge.c
# Opt level: O2

void Gia_ManFromBridgeUnknown(FILE *pFile,int iPoUnknown)

{
  int iVar1;
  
  fprintf((FILE *)pFile,"%.6d",0x65);
  fputc(0x20,(FILE *)pFile);
  iVar1 = aigerNumSize(iPoUnknown);
  fprintf((FILE *)pFile,"%.16d",(ulong)(iVar1 + 2));
  fputc(0x20,(FILE *)pFile);
  fputc(0,(FILE *)pFile);
  fputc(1,(FILE *)pFile);
  Gia_AigerWriteUnsignedFile(pFile,iPoUnknown);
  fflush((FILE *)pFile);
  return;
}

Assistant:

void Gia_ManFromBridgeUnknown( FILE * pFile, int iPoUnknown )
{
    fprintf( pFile, "%.6d", 101 /*message type = Result*/);
    fprintf( pFile, " " );
    fprintf( pFile, "%.16d", 2 + aigerNumSize(iPoUnknown) /*size in bytes*/);
    fprintf( pFile, " " );

    fputc( (char)BRIDGE_VALUE_X, pFile ); // undef
    fputc( (char)1, pFile ); // size of vector (Armin's encoding)
    Gia_AigerWriteUnsignedFile( pFile, iPoUnknown ); // number of the property (Armin's encoding)
    fflush(pFile);
}